

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O2

UnicodeString * __thiscall
icu_63::RuleBasedNumberFormat::format
          (RuleBasedNumberFormat *this,int64_t number,UnicodeString *ruleSetName,
          UnicodeString *toAppendTo,FieldPosition *param_4,UErrorCode *status)

{
  int32_t iVar1;
  NFRuleSet *ruleSet;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar1 = UnicodeString::indexOf(ruleSetName,L"%%",2,0);
    if (iVar1 == 0) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      ruleSet = findRuleSet(this,ruleSetName,status);
      if (ruleSet != (NFRuleSet *)0x0) {
        format(this,number,ruleSet,toAppendTo,status);
      }
    }
  }
  return toAppendTo;
}

Assistant:

UnicodeString&
RuleBasedNumberFormat::format(int64_t number,
                              const UnicodeString& ruleSetName,
                              UnicodeString& toAppendTo,
                              FieldPosition& /* pos */,
                              UErrorCode& status) const
{
    if (U_SUCCESS(status)) {
        if (ruleSetName.indexOf(gPercentPercent, 2, 0) == 0) {
            // throw new IllegalArgumentException("Can't use internal rule set");
            status = U_ILLEGAL_ARGUMENT_ERROR;
        } else {
            NFRuleSet *rs = findRuleSet(ruleSetName, status);
            if (rs) {
                format(number, rs, toAppendTo, status);
            }
        }
    }
    return toAppendTo;
}